

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

bool __thiscall sf::priv::GlxContext::makeCurrent(GlxContext *this,bool current)

{
  int iVar1;
  bool local_1a;
  bool result;
  bool current_local;
  GlxContext *this_local;
  
  if (this->m_context == (GLXContext)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_1a = false;
    if (current) {
      if (this->m_pbuffer == 0) {
        if (this->m_window != 0) {
          iVar1 = glXMakeCurrent(this->m_display,this->m_window,this->m_context);
          local_1a = iVar1 != 0;
        }
      }
      else {
        iVar1 = glXMakeContextCurrent
                          (this->m_display,this->m_pbuffer,this->m_pbuffer,this->m_context);
        local_1a = iVar1 != 0;
      }
    }
    else {
      iVar1 = glXMakeCurrent(this->m_display,0);
      local_1a = iVar1 != 0;
    }
    this_local._7_1_ = local_1a;
  }
  return this_local._7_1_;
}

Assistant:

bool GlxContext::makeCurrent(bool current)
{
    if (!m_context)
        return false;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    bool result = false;

    if (current)
    {
        if (m_pbuffer)
        {
            result = glXMakeContextCurrent(m_display, m_pbuffer, m_pbuffer, m_context);
        }
        else if (m_window)
        {
            result = glXMakeCurrent(m_display, m_window, m_context);
        }
    }
    else
    {
        result = glXMakeCurrent(m_display, None, NULL);
    }

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::makeCurrent()" << std::endl;
#endif

    return result;
}